

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O2

bool __thiscall
ArgsManager::ReadSettingsFile
          (ArgsManager *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *errors)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  *this_00;
  long lVar1;
  string key_00;
  bool bVar2;
  undefined1 uVar3;
  optional<unsigned_int> oVar4;
  _Base_ptr p_Var5;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  undefined7 in_stack_fffffffffffffeb8;
  _Rb_tree_node_base *p_Var6;
  pointer in_stack_fffffffffffffed0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  read_errors;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8 [32];
  KeyInfo key;
  path path;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::filesystem::__cxx11::path::path(&path.super_path);
  bVar2 = GetSettingsPath(this,(path *)&path.super_path,false,false);
  uVar3 = 1;
  if (bVar2) {
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (&criticalblock11,&this->cs_args,"cs_args",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/common/args.cpp"
               ,0x199,false);
    this_00 = &(this->m_settings).rw_settings;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
    ::clear(&this_00->_M_t);
    read_errors.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    read_errors.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    read_errors.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar3 = common::ReadSettings(&path,this_00,&read_errors);
    if ((bool)uVar3) {
      p_Var6 = &(this->m_settings).rw_settings._M_t._M_impl.super__Rb_tree_header._M_header;
      for (p_Var5 = (this->m_settings).rw_settings._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_left; p_Var5 != p_Var6; p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5))
      {
        std::__cxx11::string::string
                  (local_c8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (p_Var5 + 1));
        key_00._M_dataplus._M_p._7_1_ = uVar3;
        key_00._M_dataplus._M_p._0_7_ = in_stack_fffffffffffffeb8;
        key_00._M_string_length = (size_type)this;
        key_00.field_2._M_allocated_capacity = (size_type)p_Var6;
        key_00.field_2._8_8_ = in_stack_fffffffffffffed0;
        InterpretKey(&key,key_00);
        std::__cxx11::string::~string(local_c8);
        std::operator+(&local_e8,'-',&key.name);
        oVar4 = GetArgFlags(this,&local_e8);
        std::__cxx11::string::~string((string *)&local_e8);
        if (((ulong)oVar4.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0) {
          logging_function._M_str = "ReadSettingsFile";
          logging_function._M_len = 0x10;
          source_file._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/common/args.cpp"
          ;
          source_file._M_len = 0x5f;
          LogPrintFormatInternal<std::__cxx11::string>
                    (logging_function,source_file,0x1a3,ALL,Info,(ConstevalFormatString<1U>)0x197c7a
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (p_Var5 + 1));
        }
        KeyInfo::~KeyInfo(&key);
      }
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&stack0xfffffffffffffed0,&read_errors);
      SaveErrors((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&stack0xfffffffffffffed0,errors);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&stack0xfffffffffffffed0);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&read_errors);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock11.super_unique_lock);
  }
  std::filesystem::__cxx11::path::~path(&path.super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)uVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool ArgsManager::ReadSettingsFile(std::vector<std::string>* errors)
{
    fs::path path;
    if (!GetSettingsPath(&path, /* temp= */ false)) {
        return true; // Do nothing if settings file disabled.
    }

    LOCK(cs_args);
    m_settings.rw_settings.clear();
    std::vector<std::string> read_errors;
    if (!common::ReadSettings(path, m_settings.rw_settings, read_errors)) {
        SaveErrors(read_errors, errors);
        return false;
    }
    for (const auto& setting : m_settings.rw_settings) {
        KeyInfo key = InterpretKey(setting.first); // Split setting key into section and argname
        if (!GetArgFlags('-' + key.name)) {
            LogPrintf("Ignoring unknown rw_settings value %s\n", setting.first);
        }
    }
    return true;
}